

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O3

void idle_1_cb(uv_idle_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  fputs("IDLE_1_CB\n",_stderr);
  fflush(_stderr);
  if (handle == (uv_idle_t *)0x0) {
    pcVar4 = "!=";
    eval_a = 0;
    pcVar5 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "handle";
    uVar2 = 0x92;
    goto LAB_0013dbe1;
  }
  eval_a = (int64_t)idles_1_active;
  if (eval_a < 1) {
    pcVar4 = ">";
    pcVar3 = "idles_1_active";
    uVar2 = 0x93;
  }
  else if ((idle_2_is_active == '\0') &&
          (iVar1 = uv_is_closing((uv_handle_t *)&idle_2_handle), iVar1 == 0)) {
    loop = uv_default_loop();
    iVar1 = uv_idle_init(loop,&idle_2_handle);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_idle_start(&idle_2_handle,idle_2_cb);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        idle_2_is_active = '\x01';
        idle_2_cb_started = idle_2_cb_started + 1;
        goto LAB_0013da85;
      }
      pcVar4 = "==";
      pcVar3 = "r";
      uVar2 = 0x9a;
    }
    else {
      pcVar4 = "==";
      pcVar3 = "r";
      uVar2 = 0x98;
    }
  }
  else {
LAB_0013da85:
    idle_1_cb_called = idle_1_cb_called + 1;
    if (idle_1_cb_called % 5 != 0) {
      return;
    }
    iVar1 = uv_idle_stop(handle);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      idles_1_active = idles_1_active + -1;
      return;
    }
    pcVar4 = "==";
    pcVar3 = "r";
    uVar2 = 0xa3;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar5 = "0";
LAB_0013dbe1:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_a,pcVar4,0);
  abort();
}

Assistant:

static void idle_1_cb(uv_idle_t* handle) {
  int r;

  fprintf(stderr, "%s", "IDLE_1_CB\n");
  fflush(stderr);

  ASSERT_NOT_NULL(handle);
  ASSERT_GT(idles_1_active, 0);

  /* Init idle_2 and make it active */
  if (!idle_2_is_active && !uv_is_closing((uv_handle_t*)&idle_2_handle)) {
    r = uv_idle_init(uv_default_loop(), &idle_2_handle);
    ASSERT_OK(r);
    r = uv_idle_start(&idle_2_handle, idle_2_cb);
    ASSERT_OK(r);
    idle_2_is_active = 1;
    idle_2_cb_started++;
  }

  idle_1_cb_called++;

  if (idle_1_cb_called % 5 == 0) {
    r = uv_idle_stop((uv_idle_t*)handle);
    ASSERT_OK(r);
    idles_1_active--;
  }
}